

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var3;
  cmMakefile *this_00;
  pointer pcVar4;
  bool bVar5;
  string *psVar6;
  long *plVar7;
  long *plVar8;
  string dirs;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar2 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if ((((uVar2 < 8) && ((0x8eU >> (uVar2 & 0x1f) & 1) != 0)) ||
      (bVar5 = IsExecutableWithExports(this), bVar5)) &&
     (_Var3._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl,
     (_Var3._M_head_impl)->BuildInterfaceIncludesAppended == false)) {
    (_Var3._M_head_impl)->BuildInterfaceIncludesAppended = true;
    this_00 = (_Var3._M_head_impl)->Makefile;
    paVar1 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE","");
    bVar5 = cmMakefile::IsOn(this_00,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Makefile);
      pcVar4 = (psVar6->_M_dataplus)._M_p;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar4,pcVar4 + psVar6->_M_string_length);
      if (local_a8._M_string_length != 0) {
        std::__cxx11::string::push_back((char)&local_a8);
      }
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Makefile);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(psVar6->_M_dataplus)._M_p);
      if (local_a8._M_string_length != 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"INTERFACE_INCLUDE_DIRECTORIES","");
        std::operator+(&local_48,"$<BUILD_INTERFACE:",&local_a8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_78 = *plVar8;
          lStack_70 = plVar7[3];
          local_88 = &local_78;
        }
        else {
          local_78 = *plVar8;
          local_88 = (long *)*plVar7;
        }
        local_80 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        AppendProperty(this,&local_68,(char *)local_88,false);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return;
  }
  if (impl->BuildInterfaceIncludesAppended) {
    return;
  }
  impl->BuildInterfaceIncludesAppended = true;

  if (impl->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")) {
    std::string dirs = impl->Makefile->GetCurrentBinaryDirectory();
    if (!dirs.empty()) {
      dirs += ';';
    }
    dirs += impl->Makefile->GetCurrentSourceDirectory();
    if (!dirs.empty()) {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                           ("$<BUILD_INTERFACE:" + dirs + ">").c_str());
    }
  }
}